

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<int,_QList<int>_>_>::moveAppend
          (QGenericArrayOps<std::pair<int,_QList<int>_>_> *this,pair<int,_QList<int>_> *b,
          pair<int,_QList<int>_> *e)

{
  qsizetype *pqVar1;
  pair<int,_QList<int>_> *ppVar2;
  long lVar3;
  Data *pDVar4;
  int *piVar5;
  qsizetype qVar6;
  
  if ((b != e) && (b < e)) {
    ppVar2 = (this->super_QArrayDataPointer<std::pair<int,_QList<int>_>_>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<std::pair<int,_QList<int>_>_>).size;
      ppVar2[lVar3].first = b->first;
      pDVar4 = (b->second).d.d;
      (b->second).d.d = (Data *)0x0;
      ppVar2[lVar3].second.d.d = pDVar4;
      piVar5 = (b->second).d.ptr;
      (b->second).d.ptr = (int *)0x0;
      ppVar2[lVar3].second.d.ptr = piVar5;
      qVar6 = (b->second).d.size;
      (b->second).d.size = 0;
      ppVar2[lVar3].second.d.size = qVar6;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<std::pair<int,_QList<int>_>_>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }